

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsettings.cpp
# Opt level: O1

bool operator<(QSettingsIniKey *k1,QSettingsIniKey *k2)

{
  int iVar1;
  QStringView rhs;
  QStringView lhs;
  
  if (k1->position == k2->position) {
    rhs.m_data = (k2->super_QString).d.ptr;
    rhs.m_size = (k2->super_QString).d.size;
    lhs.m_data = (k1->super_QString).d.ptr;
    lhs.m_size = (k1->super_QString).d.size;
    iVar1 = QtPrivate::compareStrings(lhs,rhs,CaseSensitive);
    return SUB41((uint)iVar1 >> 0x1f,0);
  }
  return k1->position < k2->position;
}

Assistant:

static bool operator<(const QSettingsIniKey &k1, const QSettingsIniKey &k2)
{
    if (k1.position != k2.position)
        return k1.position < k2.position;
    return static_cast<const QString &>(k1) < static_cast<const QString &>(k2);
}